

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# satProof.c
# Opt level: O3

Vec_Int_t * Proof_CollectUsedRec(Vec_Set_t *vProof,Vec_Int_t *vRoots)

{
  int iVar1;
  Vec_Int_t *vUsed;
  int *piVar2;
  long lVar3;
  
  vUsed = (Vec_Int_t *)malloc(0x10);
  vUsed->nCap = 1000;
  vUsed->nSize = 0;
  piVar2 = (int *)malloc(4000);
  vUsed->pArray = piVar2;
  iVar1 = vRoots->nSize;
  if (0 < iVar1) {
    lVar3 = 0;
    do {
      if (-1 < vRoots->pArray[lVar3]) {
        Proof_CollectUsed_rec(vProof,vRoots->pArray[lVar3],vUsed);
        iVar1 = vRoots->nSize;
      }
      lVar3 = lVar3 + 1;
    } while (lVar3 < iVar1);
  }
  return vUsed;
}

Assistant:

Vec_Int_t * Proof_CollectUsedRec( Vec_Set_t * vProof, Vec_Int_t * vRoots )
{
    Vec_Int_t * vUsed;
    int i, Entry;
    vUsed = Vec_IntAlloc( 1000 );
    Vec_IntForEachEntry( vRoots, Entry, i )
        if ( Entry >= 0 )
            Proof_CollectUsed_rec( vProof, Entry, vUsed );
    return vUsed;
}